

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_resolv_cb(void *arg)

{
  nni_mtx *mtx;
  nng_err nVar1;
  nni_aio *aio;
  char *pcVar2;
  udp_pipe *local_30;
  udp_pipe *p;
  
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x9f0));
  if (aio == (nni_aio *)0x0) {
    nni_mtx_unlock(mtx);
    return;
  }
  if (*(char *)((long)arg + 0x36) == '\x01') {
    nni_aio_list_remove(aio);
    nni_mtx_unlock(mtx);
    nVar1 = NNG_ECLOSED;
  }
  else {
    nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x220));
    if (nVar1 == NNG_OK) {
      if (*(short *)((long)arg + 0x858) == 0) {
        *(undefined2 *)((long)arg + 0x858) = *(undefined2 *)((long)arg + 0x8e0);
      }
      if ((*arg != 0) ||
         (nVar1 = nni_plat_udp_open((nni_plat_udp **)arg,(nni_sockaddr *)((long)arg + 0x858)),
         nVar1 == NNG_OK)) {
        nVar1 = nni_pipe_alloc_dialer(&local_30,*(nni_dialer **)((long)arg + 0x3f8));
        if (nVar1 != NNG_OK) {
          nni_aio_list_remove(aio);
          nni_mtx_unlock(mtx);
          nni_aio_finish_error(aio,nVar1);
        }
        nVar1 = udp_pipe_start(local_30,(udp_ep *)arg,(nng_sockaddr *)((long)arg + 0x8e0));
        if (nVar1 != NNG_OK) {
          nni_aio_list_remove(aio);
          nni_pipe_close(local_30->npipe);
          nni_mtx_unlock(mtx);
          nni_aio_finish_error(aio,nVar1);
        }
        udp_pipe_schedule(local_30);
        *(undefined1 *)((long)arg + 0x35) = 1;
        udp_start_rx((udp_ep *)arg);
        udp_send_creq((udp_ep *)arg,local_30);
        nni_mtx_unlock(mtx);
        return;
      }
      nni_aio_list_remove(aio);
      nni_mtx_unlock(mtx);
    }
    else {
      nni_aio_list_remove(aio);
      nni_mtx_unlock(mtx);
      pcVar2 = nng_strerror(nVar1);
      nng_log_warn("NNG-UDP-RESOLV","Failed resolving IP address: %s",pcVar2);
    }
  }
  nni_aio_finish_error(aio,nVar1);
  return;
}

Assistant:

static void
udp_resolv_cb(void *arg)
{
	udp_ep   *ep = arg;
	udp_pipe *p;
	nni_aio  *aio;
	int       rv;
	nni_mtx_lock(&ep->mtx);
	if ((aio = nni_list_first(&ep->connaios)) == NULL) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (ep->closed) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if ((rv = nni_aio_result(&ep->resaio)) != 0) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nng_log_warn("NNG-UDP-RESOLV",
		    "Failed resolving IP address: %s", nng_strerror(rv));
		nni_aio_finish_error(aio, rv);
		return;
	}

	// Choose the right port to bind to. The family must match.
	if (ep->self_sa.s_family == NNG_AF_UNSPEC) {
		ep->self_sa.s_family = ep->peer_sa.s_family;
	}

	if (ep->udp == NULL) {
		if ((rv = nni_udp_open(&ep->udp, &ep->self_sa)) != 0) {
			nni_aio_list_remove(aio);
			nni_mtx_unlock(&ep->mtx);
			nni_aio_finish_error(aio, rv);
			return;
		}
	}

	// places a "hold" on the ep
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, rv);
	}
	if ((rv = udp_pipe_start(p, ep, &ep->peer_sa)) != 0) {
		nni_aio_list_remove(aio);
		nni_pipe_close(p->npipe);
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, rv);
	}

	udp_pipe_schedule(p);
	udp_ep_start(ep);

	// Send out the connection request.  We don't complete
	// the user aio until we confirm a connection, so that
	// we can supply details like maximum receive message size
	// and the protocol the peer is using.
	udp_send_creq(ep, p);
	nni_mtx_unlock(&ep->mtx);
}